

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O0

void __thiscall miniros::MasterLink::set(MasterLink *this,string *key,RpcValue *v)

{
  bool bVar1;
  string *this_00;
  key_type *__k;
  XmlRpcValue *__a;
  long *in_RDI;
  scoped_lock<std::mutex> lock;
  RpcValue payload;
  RpcValue result;
  RpcValue params;
  string mapped_key;
  bool in_stack_00000197;
  RpcValue *in_stack_00000198;
  RpcValue *in_stack_000001a0;
  RpcValue *in_stack_000001a8;
  string *in_stack_000001b0;
  MasterLink *in_stack_000001b8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffec8;
  key_type *in_stack_fffffffffffffed0;
  string *in_stack_fffffffffffffed8;
  string *in_stack_fffffffffffffee8;
  XmlRpcValue *in_stack_fffffffffffffef0;
  _Self local_e0;
  _Self local_d8;
  allocator<char> local_c9;
  string *in_stack_ffffffffffffff38;
  MasterLink *in_stack_ffffffffffffff40;
  Error local_a4 [11];
  XmlRpcValue local_78;
  XmlRpcValue local_68 [2];
  XmlRpcValue local_48;
  string local_38 [56];
  
  if (*in_RDI != 0) {
    names::resolve(in_stack_fffffffffffffed8,SUB81((ulong)in_stack_fffffffffffffed0 >> 0x38,0));
    XmlRpc::XmlRpcValue::XmlRpcValue(&local_48);
    XmlRpc::XmlRpcValue::XmlRpcValue(local_68);
    XmlRpc::XmlRpcValue::XmlRpcValue(&local_78);
    this_00 = this_node::getName_abi_cxx11_();
    XmlRpc::XmlRpcValue::XmlRpcValue(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    __k = (key_type *)
          XmlRpc::XmlRpcValue::operator[]
                    ((XmlRpcValue *)in_stack_fffffffffffffed0,
                     (int)((ulong)in_stack_fffffffffffffec8 >> 0x20));
    XmlRpc::XmlRpcValue::operator=((XmlRpcValue *)this_00,(XmlRpcValue *)__k);
    XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x45a285);
    XmlRpc::XmlRpcValue::XmlRpcValue(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    __a = XmlRpc::XmlRpcValue::operator[]
                    ((XmlRpcValue *)in_stack_fffffffffffffed0,
                     (int)((ulong)in_stack_fffffffffffffec8 >> 0x20));
    XmlRpc::XmlRpcValue::operator=((XmlRpcValue *)this_00,(XmlRpcValue *)__k);
    XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x45a2d6);
    XmlRpc::XmlRpcValue::operator[]
              ((XmlRpcValue *)in_stack_fffffffffffffed0,
               (int)((ulong)in_stack_fffffffffffffec8 >> 0x20));
    XmlRpc::XmlRpcValue::operator=((XmlRpcValue *)this_00,(XmlRpcValue *)__k);
    std::scoped_lock<std::mutex>::scoped_lock
              ((scoped_lock<std::mutex> *)in_stack_fffffffffffffed0,
               (mutex_type *)in_stack_fffffffffffffec8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__k,(allocator<char> *)__a);
    local_a4[0] = execute(in_stack_000001b8,in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,
                          in_stack_00000198,in_stack_00000197);
    bVar1 = Error::operator_cast_to_bool(local_a4);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
    std::allocator<char>::~allocator(&local_c9);
    if (bVar1) {
      local_d8._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      local_e0._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(in_stack_fffffffffffffec8);
      bVar1 = std::operator!=(&local_d8,&local_e0);
      if (bVar1) {
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>_>
        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>_>
                      *)this_00,__k);
        XmlRpc::XmlRpcValue::operator=((XmlRpcValue *)this_00,(XmlRpcValue *)__k);
      }
      invalidateParentParams(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    }
    std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x45a58c);
    XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x45a599);
    XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x45a5a6);
    XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x45a5b3);
    std::__cxx11::string::~string(local_38);
  }
  return;
}

Assistant:

void MasterLink::set(const std::string& key, const RpcValue& v)
{
  if (!internal_)
    return;

  std::string mapped_key = miniros::names::resolve(key);

  RpcValue params, result, payload;
  params[0] = this_node::getName();
  params[1] = mapped_key;
  params[2] = v;

  {
    // Lock around the execute to the master in case we get a parameter update on this value between
    // executing on the master and setting the parameter in the g_params list.
    std::scoped_lock<std::mutex> lock(internal_->params_mutex);

    if (this->execute("setParam", params, result, payload, true)) {
      // Update our cached params list now so that if get() is called immediately after param::set()
      // we already have the cached state and our value will be correct
      if (internal_->subscribed_params.find(mapped_key) != internal_->subscribed_params.end()) {
        internal_->params[mapped_key] = v;
      }
      invalidateParentParams(mapped_key);
    }
  }
}